

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

string * __thiscall test_timestep_embedding::vars_abi_cxx11_(test_timestep_embedding *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_1c0 [12];
  ggml_type in_stack_fffffffffffffe4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  string local_1a0 [8];
  array<long,_4UL> *in_stack_fffffffffffffe68;
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [48];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  __lhs = in_RDI;
  var_to_str_abi_cxx11_(in_stack_fffffffffffffe4c);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<long,4ul>(in_stack_fffffffffffffe68);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<int>(in_stack_fffffffffffffe18);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  std::operator+(__lhs,(char *)in_RDI);
  var_to_str<int>(in_stack_fffffffffffffe18);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_f0);
  return __lhs;
}

Assistant:

std::string vars() override {
        return VARS_TO_STR4(type, ne_a, dim, max_period);
    }